

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O0

Sample * __thiscall crnlib::Resampler::get_line(Resampler *this)

{
  uchar *puVar1;
  int iVar2;
  int local_1c;
  int i;
  Resampler *this_local;
  
  if (this->m_cur_dst_y == this->m_resample_dst_y) {
    this_local = (Resampler *)0x0;
  }
  else {
    for (local_1c = 0; local_1c < (int)(uint)this->m_Pclist_y[this->m_cur_dst_y].n;
        local_1c = local_1c + 1) {
      puVar1 = this->m_Psrc_y_flag;
      iVar2 = resampler_range_check
                        ((uint)this->m_Pclist_y[this->m_cur_dst_y].p[local_1c].pixel,
                         this->m_resample_src_y);
      if (puVar1[iVar2] == '\0') {
        return (Sample *)0x0;
      }
    }
    resample_y(this,this->m_Pdst_buf);
    this->m_cur_dst_y = this->m_cur_dst_y + 1;
    this_local = (Resampler *)this->m_Pdst_buf;
  }
  return (Sample *)this_local;
}

Assistant:

const Resampler::Sample* Resampler::get_line()
    {
        int i;

        /* If all the destination lines have been
      * generated, then always return nullptr.
      */

        if (m_cur_dst_y == m_resample_dst_y)
        {
            return nullptr;
        }

        /* Check to see if all the required
      * contributors are present, if not,
      * return nullptr.
      */

        for (i = 0; i < m_Pclist_y[m_cur_dst_y].n; i++)
        {
            if (!m_Psrc_y_flag[resampler_range_check(m_Pclist_y[m_cur_dst_y].p[i].pixel, m_resample_src_y)])
            {
                return nullptr;
            }
        }

        resample_y(m_Pdst_buf);

        m_cur_dst_y++;

        return m_Pdst_buf;
    }